

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.hpp
# Opt level: O0

idx_t_conflict
CaPS_SA::Suffix_Array<unsigned_long>::LCP<8ul>(char *x,char *y,idx_t_conflict min_len)

{
  idx_t_conflict iVar1;
  char *in_RDX;
  char *in_RSI;
  idx_t_conflict l;
  idx_t_conflict lcp;
  char *in_stack_00000058;
  char *in_stack_00000060;
  idx_t_conflict min_len_00;
  
  min_len_00 = 0;
  do {
    if ((long)in_RDX - min_len_00 < 0x100) {
      iVar1 = LCP<7ul>(in_RSI,in_RDX,min_len_00);
      return min_len_00 + iVar1;
    }
    iVar1 = LCP_unrolled<8ul>(in_stack_00000060,in_stack_00000058);
    min_len_00 = iVar1 + min_len_00;
  } while (0xff < iVar1);
  return min_len_00;
}

Assistant:

inline T_idx_ Suffix_Array<T_idx_>::LCP(const char* const x, const char* const y, const idx_t min_len)
{
    idx_t lcp = 0;

    if constexpr(N == 1)
    {
        for(; lcp < min_len; ++lcp)
            if(x[lcp] != y[lcp])
                break;

        return lcp;
    }
    else
    {
        while((min_len - lcp) >= N * 32)
        {
            const auto l = LCP_unrolled<N>(x + lcp, y + lcp);
            lcp += l;
            if(l < N * 32)
                return lcp;
        }

        return lcp + LCP<N - 1>(x + lcp, y + lcp, min_len - lcp);
    }
}